

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::BitState<unsigned_long>,unsigned_long,duckdb::BitAndOperation>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  unsigned_long *puVar1;
  char *pcVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  data_ptr_t pdVar5;
  data_ptr_t pdVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  idx_t iVar11;
  idx_t iVar12;
  idx_t iVar13;
  ulong uVar14;
  ulong uVar15;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_b8;
  UnifiedVectorFormat local_70;
  
  if (input->vector_type == FLAT_VECTOR) {
    if (states->vector_type == FLAT_VECTOR) {
      pdVar5 = input->data;
      pdVar6 = states->data;
      FlatVector::VerifyFlatVector(input);
      puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        if (count == 0) {
          return;
        }
        iVar11 = 0;
        do {
          pcVar2 = *(char **)(pdVar6 + iVar11 * 8);
          uVar7 = *(ulong *)(pdVar5 + iVar11 * 8);
          if (*pcVar2 == '\0') {
            *pcVar2 = '\x01';
          }
          else {
            uVar7 = uVar7 & *(ulong *)(pcVar2 + 8);
          }
          *(ulong *)(pcVar2 + 8) = uVar7;
          iVar11 = iVar11 + 1;
        } while (count != iVar11);
        return;
      }
      if (count + 0x3f < 0x40) {
        return;
      }
      uVar8 = 0;
      uVar7 = 0;
      do {
        uVar14 = puVar1[uVar8];
        uVar9 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar9 = count;
        }
        uVar10 = uVar9;
        if (uVar14 != 0) {
          uVar10 = uVar7;
          if (uVar14 == 0xffffffffffffffff) {
            if (uVar7 < uVar9) {
              do {
                pcVar2 = *(char **)(pdVar6 + uVar7 * 8);
                uVar14 = *(ulong *)(pdVar5 + uVar7 * 8);
                if (*pcVar2 == '\0') {
                  *pcVar2 = '\x01';
                }
                else {
                  uVar14 = uVar14 & *(ulong *)(pcVar2 + 8);
                }
                *(ulong *)(pcVar2 + 8) = uVar14;
                uVar7 = uVar7 + 1;
                uVar10 = uVar9;
              } while (uVar9 != uVar7);
            }
          }
          else if (uVar7 < uVar9) {
            uVar15 = 0;
            do {
              if ((uVar14 >> (uVar15 & 0x3f) & 1) != 0) {
                pcVar2 = *(char **)(pdVar6 + uVar15 * 8 + uVar7 * 8);
                if (*pcVar2 == '\0') {
                  *(ulong *)(pcVar2 + 8) = *(ulong *)(pdVar5 + uVar15 * 8 + uVar7 * 8);
                  *pcVar2 = '\x01';
                }
                else {
                  *(ulong *)(pcVar2 + 8) =
                       *(ulong *)(pcVar2 + 8) & *(ulong *)(pdVar5 + uVar15 * 8 + uVar7 * 8);
                }
              }
              uVar15 = uVar15 + 1;
              uVar10 = uVar9;
            } while (uVar9 - uVar7 != uVar15);
          }
        }
        uVar8 = uVar8 + 1;
        uVar7 = uVar10;
      } while (uVar8 != count + 0x3f >> 6);
      return;
    }
  }
  else if ((input->vector_type == CONSTANT_VECTOR) && (states->vector_type == CONSTANT_VECTOR)) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) {
      return;
    }
    pcVar2 = *(char **)states->data;
    uVar7 = *(ulong *)input->data;
    if (*pcVar2 == '\0') {
      *pcVar2 = '\x01';
    }
    else {
      uVar7 = uVar7 & *(ulong *)(pcVar2 + 8);
    }
    *(ulong *)(pcVar2 + 8) = uVar7;
    return;
  }
  UnifiedVectorFormat::UnifiedVectorFormat(&local_b8);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_70);
  Vector::ToUnifiedFormat(input,count,&local_b8);
  Vector::ToUnifiedFormat(states,count,&local_70);
  if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      psVar3 = (local_b8.sel)->sel_vector;
      psVar4 = (local_70.sel)->sel_vector;
      iVar11 = 0;
      do {
        iVar12 = iVar11;
        if (psVar3 != (sel_t *)0x0) {
          iVar12 = (idx_t)psVar3[iVar11];
        }
        iVar13 = iVar11;
        if (psVar4 != (sel_t *)0x0) {
          iVar13 = (idx_t)psVar4[iVar11];
        }
        pcVar2 = *(char **)(local_70.data + iVar13 * 8);
        uVar7 = *(ulong *)(local_b8.data + iVar12 * 8);
        if (*pcVar2 == '\0') {
          *pcVar2 = '\x01';
        }
        else {
          uVar7 = uVar7 & *(ulong *)(pcVar2 + 8);
        }
        *(ulong *)(pcVar2 + 8) = uVar7;
        iVar11 = iVar11 + 1;
      } while (count != iVar11);
    }
  }
  else if (count != 0) {
    psVar3 = (local_b8.sel)->sel_vector;
    psVar4 = (local_70.sel)->sel_vector;
    iVar11 = 0;
    do {
      iVar12 = iVar11;
      if (psVar3 != (sel_t *)0x0) {
        iVar12 = (idx_t)psVar3[iVar11];
      }
      iVar13 = iVar11;
      if (psVar4 != (sel_t *)0x0) {
        iVar13 = (idx_t)psVar4[iVar11];
      }
      if ((local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar12 >> 6]
           >> (iVar12 & 0x3f) & 1) != 0) {
        pcVar2 = *(char **)(local_70.data + iVar13 * 8);
        if (*pcVar2 == '\0') {
          *(ulong *)(pcVar2 + 8) = *(ulong *)(local_b8.data + iVar12 * 8);
          *pcVar2 = '\x01';
        }
        else {
          *(ulong *)(pcVar2 + 8) = *(ulong *)(pcVar2 + 8) & *(ulong *)(local_b8.data + iVar12 * 8);
        }
      }
      iVar11 = iVar11 + 1;
    } while (count != iVar11);
  }
  if (local_70.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_b8.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}